

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void dec_calc_subpel_params_and_extend
               (MV *src_mv,InterPredParams *inter_pred_params,MACROBLOCKD *xd,int mi_x,int mi_y,
               int ref,uint8_t **mc_buf,uint8_t **pre,SubpelParams *subpel_params,int *src_stride)

{
  MV32 scaled_mv_00;
  undefined4 in_ECX;
  undefined8 in_RDX;
  MV *unaff_RBX;
  uint8_t **unaff_RBP;
  MACROBLOCKD *in_RSI;
  InterPredParams *in_RDI;
  undefined4 in_R8D;
  int32_t in_R9D;
  int unaff_R14D;
  SubpelParams *unaff_R15;
  PadBlock *unaff_retaddr;
  MV32 *in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int subpel_y_mv;
  int subpel_x_mv;
  MV32 scaled_mv;
  PadBlock block;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  scale_factors *in_stack_ffffffffffffffa0;
  PadBlock in_stack_ffffffffffffffa8;
  int32_t in_stack_ffffffffffffffb8;
  
  dec_calc_subpel_params
            (unaff_RBX,in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,
             (uint8_t **)CONCAT44(in_ECX,in_R8D),unaff_R15,(int *)unaff_RBP,unaff_retaddr,
             in_stack_00000008,in_stack_00000010,in_stack_00000018);
  scaled_mv_00.col = in_R9D;
  scaled_mv_00.row = in_stack_ffffffffffffffb8;
  extend_mc_border(in_stack_ffffffffffffffa0,
                   (buf_2d *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   scaled_mv_00,in_stack_ffffffffffffffa8,in_stack_ffffffffffffff94,(int)in_RSI,
                   (int)in_RDI,(int)unaff_RBX,unaff_R14D,(uint8_t *)unaff_R15,unaff_RBP,
                   &unaff_retaddr->x0);
  return;
}

Assistant:

static inline void dec_calc_subpel_params_and_extend(
    const MV *const src_mv, InterPredParams *const inter_pred_params,
    MACROBLOCKD *const xd, int mi_x, int mi_y, int ref, uint8_t **mc_buf,
    uint8_t **pre, SubpelParams *subpel_params, int *src_stride) {
  PadBlock block;
  MV32 scaled_mv;
  int subpel_x_mv, subpel_y_mv;
  dec_calc_subpel_params(src_mv, inter_pred_params, xd, mi_x, mi_y, pre,
                         subpel_params, src_stride, &block, &scaled_mv,
                         &subpel_x_mv, &subpel_y_mv);
  extend_mc_border(
      inter_pred_params->scale_factors, &inter_pred_params->ref_frame_buf,
      scaled_mv, block, subpel_x_mv, subpel_y_mv,
      inter_pred_params->mode == WARP_PRED, inter_pred_params->is_intrabc,
      inter_pred_params->use_hbd_buf, mc_buf[ref], pre, src_stride);
}